

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          FixedArray<char,_1UL> *params_3)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_48;
  size_t local_40;
  size_t local_38;
  undefined8 local_30;
  
  local_48 = *(undefined8 *)(this + 8);
  local_40 = params->size_;
  local_38 = params_1->size_;
  local_30 = 1;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x4;
  size = sum((_ *)&local_48,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (target,(ArrayPtr<const_char> *)this,params,params_1,(FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}